

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O1

void __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::set_charclass_posinfo
          (re_compiler<char,_srell::u8regex_traits<char>_> *this)

{
  re_character_class *this_00;
  pointer prVar1;
  range_pair *prVar2;
  long lVar3;
  ulong uVar4;
  
  this_00 = &(this->super_re_object_core<char,_srell::u8regex_traits<char>_>).character_class;
  re_character_class::finalise(this_00);
  if (1 < (this->super_re_object_core<char,_srell::u8regex_traits<char>_>).NFA_states.size_) {
    uVar4 = 1;
    lVar3 = 0x44;
    do {
      prVar1 = (this->super_re_object_core<char,_srell::u8regex_traits<char>_>).NFA_states.buffer_;
      if (*(int *)((long)prVar1 + lVar3 + -0x18) == 1) {
        prVar2 = re_character_class::charclasspos(this_00,*(uint *)((long)prVar1 + lVar3 + -0x1c));
        *(range_pair *)((long)prVar1 + lVar3 + -4) = *prVar2;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < (this->super_re_object_core<char,_srell::u8regex_traits<char>_>).NFA_states.
                     size_);
  }
  return;
}

Assistant:

void set_charclass_posinfo()
	{
		this->character_class.finalise();
		for (typename state_array::size_type i = 1; i < this->NFA_states.size(); ++i)
		{
			state_type &state = this->NFA_states[i];

			if (state.type == st_character_class)
			{
				const range_pair &posinfo = this->character_class.charclasspos(state.number);
				state.quantifier.setccpos(posinfo.first, posinfo.second);
			}
		}
	}